

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cc
# Opt level: O2

bool __thiscall raptor::Client::Connect(Client *this,char *addr,size_t timeout_ms)

{
  raptor_error e;
  string local_28;
  
  TcpClient::Connect((TcpClient *)&e,(char *)this->_impl,(size_t)addr);
  if (e._value != (Status *)0x0) {
    Status::ToString_abi_cxx11_(&local_28,e._value);
    LogFormatPrint("/workspace/llm4binary/github/license_all_cmakelists_1510/shadow-yuan[P]raptor/surface/client.cc"
                   ,0x36,kLogLevelError,"client: connect (%s)",local_28._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_28);
  }
  RefCountedPtr<raptor::Status>::~RefCountedPtr(&e);
  return e._value == (Status *)0x0;
}

Assistant:

bool Client::Connect(const char* addr, size_t timeout_ms) {
    raptor_error e = _impl->Connect(addr, timeout_ms);
    if (e != RAPTOR_ERROR_NONE) {
        log_error("client: connect (%s)", e->ToString().c_str());
        return false;
    }
    return true;
}